

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O2

const_iterator __thiscall
QJsonObject::constFindImpl<QLatin1String>(QJsonObject *this,QLatin1String key)

{
  QCborContainerPrivate *pQVar1;
  qsizetype qVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  const_iterator cVar4;
  bool keyExists;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  keyExists = false;
  uVar3 = 1;
  if ((this->o).d.ptr != (QCborContainerPrivate *)0x0) {
    qVar2 = indexOf<QLatin1String>(&this->o,key,&keyExists);
    if ((keyExists & 1U) == 0) {
      pQVar1 = (this->o).d.ptr;
      if (pQVar1 != (QCborContainerPrivate *)0x0) {
        uVar3 = (pQVar1->elements).d.size | 1;
      }
    }
    else {
      uVar3 = (qVar2 / 2) * 2 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    cVar4.item._8_8_ = uVar3;
    cVar4.item.field_0.o = this;
    return (const_iterator)cVar4.item;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::const_iterator QJsonObject::constFindImpl(T key) const
{
    bool keyExists = false;
    auto index = o ? indexOf(o, key, &keyExists) : 0;
    if (!keyExists)
        return end();
    return {this, index / 2};
}